

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void * safemalloc(size_t factor1,size_t factor2,size_t addend)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  ulong uVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = factor2;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = factor1;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    uVar4 = factor2 * factor1;
    if (!CARRY8(addend,uVar4)) {
      pvVar3 = malloc(uVar4 + addend + (ulong)(addend + uVar4 == 0));
      if (pvVar3 != (void *)0x0) {
        return pvVar3;
      }
    }
  }
  out_of_memory();
}

Assistant:

void *safemalloc(size_t factor1, size_t factor2, size_t addend)
{
    if (factor1 > SIZE_MAX / factor2)
        goto fail;
    size_t product = factor1 * factor2;

    if (addend > SIZE_MAX)
        goto fail;
    if (product > SIZE_MAX - addend)
        goto fail;
    size_t size = product + addend;

    if (size == 0)
        size = 1;

    void *p;
#ifdef MINEFIELD
    p = minefield_c_malloc(size);
#else
    p = malloc(size);
#endif

    if (!p)
        goto fail;

    return p;

  fail:
    out_of_memory();
}